

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O1

bool __thiscall CCoinsViewDB::HaveCoin(CCoinsViewDB *this,COutPoint *outpoint)

{
  CDBWrapper *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  Span<const_std::byte> key;
  DataStream local_48;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> local_28;
  COutPoint *local_20;
  uchar local_18 [8];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->m_db)._M_t.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>.
            _M_t.super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
            super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl;
  local_18[0] = 'C';
  local_48.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.m_read_pos = 0;
  local_48.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20 = outpoint;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve(&local_48.vch,0x40);
  local_28.m_object = &local_20->n;
  SerializeMany<DataStream,unsigned_char,transaction_identifier<false>,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
            (&local_48,local_18,&local_20->hash,&local_28);
  key.m_data = local_48.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_start + local_48.m_read_pos;
  key.m_size = (long)local_48.vch.
                     super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)key.m_data;
  bVar1 = CDBWrapper::ExistsImpl(this_00,key);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewDB::HaveCoin(const COutPoint &outpoint) const {
    return m_db->Exists(CoinEntry(&outpoint));
}